

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::QuadMesh::getPrimBounds
          (box3f *__return_storage_ptr__,QuadMesh *this,size_t primID,affine3f *xfm)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer pvVar18;
  pointer pvVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  auVar24 = _DAT_0014c350;
  uVar28 = DAT_0014c350;
  (__return_storage_ptr__->upper).y = (float)(int)uVar28;
  (__return_storage_ptr__->upper).z = (float)(int)((ulong)uVar28 >> 0x20);
  pvVar18 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar19 = (this->index).super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
            _M_impl.super__Vector_impl_data._M_start;
  fVar33 = pvVar18[pvVar19[primID].x].x;
  fVar23 = (xfm->l).vx.z;
  fVar20 = (xfm->l).vy.z;
  uVar2 = pvVar18[pvVar19[primID].x].y;
  uVar10 = pvVar18[pvVar19[primID].x].z;
  fVar1 = (xfm->l).vz.z;
  fVar21 = (xfm->p).z;
  fVar25 = (float)uVar10 * fVar1 + fVar33 * fVar23 + (float)uVar2 * fVar20 + fVar21;
  uVar3 = (xfm->l).vx.x;
  uVar11 = (xfm->l).vx.y;
  uVar4 = (xfm->l).vy.x;
  uVar12 = (xfm->l).vy.y;
  uVar5 = (xfm->l).vz.x;
  uVar13 = (xfm->l).vz.y;
  uVar6 = (xfm->p).x;
  uVar14 = (xfm->p).y;
  auVar36._0_8_ =
       CONCAT44((float)uVar10 * (float)uVar13 +
                (float)uVar2 * (float)uVar12 + fVar33 * (float)uVar11 + (float)uVar14,
                (float)uVar10 * (float)uVar5 + (float)uVar2 * (float)uVar4 + fVar33 * (float)uVar3 +
                (float)uVar6);
  auVar36._8_4_ = (float)uVar10 * 0.0 + (float)uVar2 * 0.0 + fVar33 * 0.0 + 0.0;
  auVar36._12_4_ = (float)uVar10 * 0.0 + (float)uVar2 * 0.0 + fVar33 * 0.0 + 0.0;
  auVar32._8_4_ = auVar36._8_4_;
  auVar32._0_8_ = auVar36._0_8_;
  auVar32._12_4_ = auVar36._12_4_;
  auVar32 = minps(auVar32,_DAT_0014c360);
  fVar33 = fVar25;
  if (3.4028235e+38 <= fVar25) {
    fVar33 = 3.4028235e+38;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar32._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar33;
  auVar24 = maxps(auVar36,auVar24);
  if (fVar25 <= -3.4028235e+38) {
    fVar25 = -3.4028235e+38;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar24._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar25;
  fVar31 = pvVar18[pvVar19[primID].y].x;
  uVar7 = pvVar18[pvVar19[primID].y].y;
  uVar15 = pvVar18[pvVar19[primID].y].z;
  fVar27 = fVar1 * (float)uVar15 + fVar23 * fVar31 + fVar20 * (float)uVar7 + fVar21;
  auVar30._0_8_ =
       CONCAT44((float)uVar15 * (float)uVar13 +
                (float)uVar7 * (float)uVar12 + fVar31 * (float)uVar11 + (float)uVar14,
                (float)uVar15 * (float)uVar5 + (float)uVar7 * (float)uVar4 + fVar31 * (float)uVar3 +
                (float)uVar6);
  auVar30._8_4_ = (float)uVar15 * 0.0 + (float)uVar7 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar30._12_4_ = (float)uVar15 * 0.0 + (float)uVar7 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar35._8_4_ = auVar30._8_4_;
  auVar35._0_8_ = auVar30._0_8_;
  auVar35._12_4_ = auVar30._12_4_;
  auVar36 = minps(auVar35,auVar32);
  fVar31 = fVar27;
  if (fVar33 <= fVar27) {
    fVar31 = fVar33;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar36._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar31;
  auVar24 = maxps(auVar30,auVar24);
  if (fVar27 <= fVar25) {
    fVar27 = fVar25;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar24._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar27;
  fVar33 = pvVar18[pvVar19[primID].z].x;
  uVar8 = pvVar18[pvVar19[primID].z].y;
  uVar16 = pvVar18[pvVar19[primID].z].z;
  fVar25 = fVar1 * (float)uVar16 + fVar23 * fVar33 + fVar20 * (float)uVar8 + fVar21;
  auVar26._0_8_ =
       CONCAT44((float)uVar16 * (float)uVar13 +
                (float)uVar8 * (float)uVar12 + fVar33 * (float)uVar11 + (float)uVar14,
                (float)uVar16 * (float)uVar5 + (float)uVar8 * (float)uVar4 + fVar33 * (float)uVar3 +
                (float)uVar6);
  auVar26._8_4_ = (float)uVar16 * 0.0 + (float)uVar8 * 0.0 + fVar33 * 0.0 + 0.0;
  auVar26._12_4_ = (float)uVar16 * 0.0 + (float)uVar8 * 0.0 + fVar33 * 0.0 + 0.0;
  auVar34._8_4_ = auVar26._8_4_;
  auVar34._0_8_ = auVar26._0_8_;
  auVar34._12_4_ = auVar26._12_4_;
  auVar36 = minps(auVar34,auVar36);
  fVar33 = fVar25;
  if (fVar31 <= fVar25) {
    fVar33 = fVar31;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar36._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar33;
  auVar24 = maxps(auVar26,auVar24);
  if (fVar25 <= fVar27) {
    fVar25 = fVar27;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar24._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar25;
  fVar31 = pvVar18[pvVar19[primID].w].x;
  uVar9 = pvVar18[pvVar19[primID].w].y;
  uVar17 = pvVar18[pvVar19[primID].w].z;
  fVar21 = fVar1 * (float)uVar17 + fVar23 * fVar31 + fVar20 * (float)uVar9 + fVar21;
  auVar29._0_8_ =
       CONCAT44((float)uVar17 * (float)uVar13 +
                (float)uVar9 * (float)uVar12 + fVar31 * (float)uVar11 + (float)uVar14,
                (float)uVar17 * (float)uVar5 + (float)uVar9 * (float)uVar4 + fVar31 * (float)uVar3 +
                (float)uVar6);
  auVar29._8_4_ = (float)uVar17 * 0.0 + (float)uVar9 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar29._12_4_ = (float)uVar17 * 0.0 + (float)uVar9 * 0.0 + fVar31 * 0.0 + 0.0;
  auVar22._8_4_ = auVar29._8_4_;
  auVar22._0_8_ = auVar29._0_8_;
  auVar22._12_4_ = auVar29._12_4_;
  auVar36 = minps(auVar22,auVar36);
  fVar23 = fVar21;
  if (fVar33 <= fVar21) {
    fVar23 = fVar33;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar36._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar23;
  auVar24 = maxps(auVar29,auVar24);
  if (fVar21 <= fVar25) {
    fVar21 = fVar25;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar24._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar21;
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].w]));
    return primBounds;
  }